

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits)

{
  Module *this_00;
  uint64_t uVar1;
  bool bVar2;
  long *local_80;
  _Head_base<0UL,_wabt::MemoryImport_*,_false> local_78;
  string local_70;
  string_view local_50;
  string_view local_40;
  
  local_50.size_ = field_name.size_;
  local_50.data_ = field_name.data_;
  local_40.size_ = module_name.size_;
  local_40.data_ = module_name.data_;
  MakeUnique<wabt::MemoryImport>();
  string_view::to_string_abi_cxx11_(&local_70,&local_40);
  std::__cxx11::string::operator=
            ((string *)
             &((local_78._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
              module_name,(string *)&local_70);
  std::__cxx11::string::_M_dispose();
  string_view::to_string_abi_cxx11_(&local_70,&local_50);
  std::__cxx11::string::operator=
            ((string *)
             &((local_78._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
              field_name,(string *)&local_70);
  std::__cxx11::string::_M_dispose();
  bVar2 = page_limits->is_shared;
  ((local_78._M_head_impl)->memory).page_limits.has_max = page_limits->has_max;
  ((local_78._M_head_impl)->memory).page_limits.is_shared = bVar2;
  uVar1 = page_limits->max;
  ((local_78._M_head_impl)->memory).page_limits.initial = page_limits->initial;
  ((local_78._M_head_impl)->memory).page_limits.max = uVar1;
  this_00 = this->module_;
  GetLocation((Location *)&local_70,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((wabt *)&local_80,
             (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)&local_78,
             (Location *)&local_70);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_80);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  local_80 = (long *)0x0;
  if (local_78._M_head_impl != (MemoryImport *)0x0) {
    (*((local_78._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import
      [1])();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits) {
  auto import = MakeUnique<MemoryImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->memory.page_limits = *page_limits;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}